

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O0

int main_body<dynet::GRUBuilder>(variables_map *vm)

{
  __pid_t _Var1;
  size_type sVar2;
  uint *puVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  void *pvVar6;
  long *plVar7;
  Model *pMVar8;
  bool *pbVar9;
  AttentionalModel<dynet::GRUBuilder> *this;
  uint uVar10;
  uint uVar11;
  long in_RDI;
  uint uVar12;
  uint uVar13;
  bool bVar14;
  bool add_fer;
  AttentionalModel<dynet::GRUBuilder> am;
  uint sgd_type;
  Trainer *sgd;
  Model model;
  ostringstream os;
  string fname;
  tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int> *sent_2
  ;
  iterator __end2_2;
  iterator __begin2_2;
  Corpus *__range2_2;
  tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int> *sent_1
  ;
  iterator __end2_1;
  iterator __begin2_1;
  Corpus *__range2_1;
  tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int> *sent;
  iterator __end2;
  iterator __begin2;
  Corpus *__range2;
  string line;
  Corpus testing;
  Corpus devel;
  Corpus training;
  string flavour;
  bool doco;
  bool swap;
  bool fert;
  bool giza_fert;
  bool giza_markov;
  bool giza_pos;
  bool giza;
  bool bidir;
  undefined4 in_stack_ffffffffffffe738;
  uint uVar15;
  real in_stack_ffffffffffffe73c;
  real in_stack_ffffffffffffe740;
  real in_stack_ffffffffffffe744;
  float in_stack_ffffffffffffe748;
  float in_stack_ffffffffffffe74c;
  float in_stack_ffffffffffffe750;
  float in_stack_ffffffffffffe754;
  undefined4 in_stack_ffffffffffffe758;
  undefined4 in_stack_ffffffffffffe75c;
  undefined4 in_stack_ffffffffffffe760;
  undefined4 in_stack_ffffffffffffe764;
  Dict *in_stack_ffffffffffffe788;
  Dict *in_stack_ffffffffffffe790;
  allocator *paVar16;
  string *in_stack_ffffffffffffe7a0;
  Dict *in_stack_ffffffffffffe7a8;
  undefined8 in_stack_ffffffffffffe828;
  undefined1 global_fert;
  Corpus *in_stack_ffffffffffffe830;
  AttentionalModel<dynet::GRUBuilder> *in_stack_ffffffffffffe838;
  Model *in_stack_ffffffffffffe840;
  undefined8 in_stack_ffffffffffffe908;
  allocator *in_stack_ffffffffffffe910;
  undefined7 in_stack_ffffffffffffe918;
  byte bVar17;
  byte bVar18;
  allocator *paVar19;
  undefined8 in_stack_ffffffffffffeac0;
  undefined1 uVar20;
  string *in_stack_ffffffffffffeac8;
  ostream *in_stack_ffffffffffffeb38;
  ostream *in_stack_ffffffffffffeb40;
  AttentionalModel<dynet::GRUBuilder> *in_stack_ffffffffffffeb48;
  variable_value *in_stack_ffffffffffffeb50;
  bool local_126a;
  size_type in_stack_ffffffffffffed98;
  uint top_k;
  string *in_stack_ffffffffffffeda0;
  AttentionalModel<dynet::GRUBuilder> *in_stack_ffffffffffffeda8;
  undefined6 in_stack_ffffffffffffedb0;
  undefined1 uVar21;
  bool local_1229;
  allocator local_1149;
  string local_1148 [39];
  allocator local_1121;
  string local_1120 [39];
  allocator local_10f9;
  string local_10f8 [39];
  allocator local_10d1;
  string local_10d0 [32];
  string local_10b0 [39];
  allocator local_1089;
  string local_1088 [39];
  allocator local_1061;
  string local_1060 [39];
  allocator local_1039;
  string local_1038 [39];
  allocator local_1011;
  string local_1010 [32];
  string local_ff0 [39];
  allocator local_fc9;
  string local_fc8 [39];
  allocator local_fa1;
  string local_fa0 [39];
  allocator local_f79;
  string local_f78 [39];
  allocator local_f51;
  string local_f50 [39];
  allocator local_f29;
  string local_f28 [32];
  string local_f08 [37];
  byte local_ee3;
  byte local_ee2;
  allocator local_ee1;
  string local_ee0 [2];
  undefined1 in_stack_fffffffffffff122;
  undefined1 in_stack_fffffffffffff123;
  undefined1 in_stack_fffffffffffff124;
  undefined1 in_stack_fffffffffffff125;
  undefined1 in_stack_fffffffffffff126;
  undefined1 in_stack_fffffffffffff127;
  uint in_stack_fffffffffffff128;
  uint in_stack_fffffffffffff12c;
  uint in_stack_fffffffffffff130;
  uint in_stack_fffffffffffff134;
  undefined2 uVar22;
  float in_stack_fffffffffffff138;
  undefined2 in_stack_fffffffffffff13c;
  undefined1 in_stack_fffffffffffff13e;
  undefined1 in_stack_fffffffffffff13f;
  undefined5 in_stack_fffffffffffff140;
  undefined1 in_stack_fffffffffffff145;
  byte bVar23;
  undefined1 in_stack_fffffffffffff146;
  byte bVar24;
  allocator in_stack_fffffffffffff147;
  Trainer *in_stack_fffffffffffff148;
  Corpus *in_stack_fffffffffffff150;
  Corpus *in_stack_fffffffffffff158;
  AttentionalModel<dynet::GRUBuilder> *in_stack_fffffffffffff160;
  Model *in_stack_fffffffffffff168;
  uint in_stack_fffffffffffff170;
  int in_stack_fffffffffffff188;
  allocator local_e69;
  string local_e68 [39];
  allocator local_e41;
  string local_e40 [37];
  byte local_e1b;
  byte local_e1a;
  allocator local_e19;
  string local_e18 [39];
  allocator local_df1;
  string local_df0 [39];
  byte local_dc9;
  allocator local_9a1;
  string local_9a0 [39];
  allocator local_979;
  string local_978 [38];
  undefined1 local_952;
  allocator local_951;
  string local_950 [38];
  undefined1 local_92a;
  allocator local_929;
  string local_928 [38];
  undefined1 local_902;
  allocator local_901;
  string local_900 [38];
  undefined1 local_8da;
  allocator local_8d9;
  string local_8d8 [39];
  allocator local_8b1;
  string local_8b0 [36];
  uint local_88c;
  long *local_888;
  Model local_880 [136];
  string local_7f8 [32];
  ostringstream local_7d8 [383];
  allocator local_659;
  string local_658 [39];
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [39];
  allocator local_5e1;
  string local_5e0 [32];
  string local_5c0 [32];
  reference local_5a0;
  tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
  *local_598;
  __normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
  local_590;
  undefined1 *local_588;
  reference local_580;
  tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
  *local_578;
  __normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
  local_570;
  undefined1 *local_568;
  reference local_560;
  tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
  *local_558;
  __normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
  local_550;
  undefined1 *local_548;
  allocator local_539;
  string local_538 [63];
  allocator local_4f9;
  string local_4f8 [37];
  byte local_4d3;
  byte local_4d2;
  allocator local_4d1;
  string local_4d0 [39];
  allocator local_4a9;
  string local_4a8 [39];
  allocator local_481;
  string local_480 [63];
  allocator local_441;
  string local_440 [39];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [63];
  allocator local_3b1;
  string local_3b0 [32];
  string local_390 [32];
  undefined1 local_370 [24];
  undefined1 local_358 [24];
  undefined1 local_340 [31];
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [38];
  byte local_282;
  allocator local_281;
  string local_280 [38];
  byte local_25a;
  allocator local_259;
  string local_258 [36];
  byte local_234;
  byte local_233;
  byte local_232;
  allocator local_231;
  string local_230 [36];
  byte local_20c;
  byte local_20b;
  byte local_20a;
  undefined1 local_209 [37];
  byte local_1e4;
  byte local_1e3;
  byte local_1e2;
  allocator local_1e1;
  string local_1e0 [38];
  byte local_1ba;
  allocator local_1b9;
  string local_1b8 [38];
  byte local_192;
  allocator local_191;
  string local_190 [38];
  byte local_16a;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [40];
  
  uVar20 = (undefined1)((ulong)in_stack_ffffffffffffeac0 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"<s>",&local_41);
  kSRC_SOS = dynet::Dict::convert(in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"</s>",&local_79);
  kSRC_EOS = dynet::Dict::convert(in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"<s>",&local_a1);
  kTGT_SOS = dynet::Dict::convert(in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"</s>",&local_c9);
  kTGT_EOS = dynet::Dict::convert(in_stack_ffffffffffffe7a8,in_stack_ffffffffffffe7a0);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"verbose",&local_f1);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                  (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
  verbose = sVar2 != 0;
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"layers",&local_119);
  boost::program_options::variables_map::operator[]
            ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
             (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
  puVar3 = (uint *)boost::program_options::variable_value::as<int>((variable_value *)0x16f2f7);
  LAYERS = *puVar3;
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"align",&local_141);
  boost::program_options::variables_map::operator[]
            ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
             (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
  puVar3 = (uint *)boost::program_options::variable_value::as<int>((variable_value *)0x16f38d);
  ALIGN_DIM = *puVar3;
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"hidden",&local_169);
  boost::program_options::variables_map::operator[]
            ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
             (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
  puVar3 = (uint *)boost::program_options::variable_value::as<int>((variable_value *)0x16f423);
  HIDDEN_DIM = *puVar3;
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_190,"bidirectional",&local_191);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                  (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  local_16a = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"giza",&local_1b9);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                  (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
  bVar14 = sVar2 != 0;
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  local_1e2 = 0;
  local_1e3 = 0;
  local_1229 = true;
  local_192 = bVar14;
  if (!bVar14) {
    std::allocator<char>::allocator();
    local_1e2 = 1;
    std::__cxx11::string::string(local_1e0,"gz-position",&local_1e1);
    local_1e3 = 1;
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                    (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
    local_1229 = sVar2 != 0;
  }
  if ((local_1e3 & 1) != 0) {
    std::__cxx11::string::~string(local_1e0);
  }
  if ((local_1e2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  }
  local_1ba = local_1229 & 1;
  local_20a = 0;
  local_20b = 0;
  bVar14 = true;
  if ((local_192 & 1) == 0) {
    in_stack_ffffffffffffeda0 = (string *)(in_RDI + 0x10);
    in_stack_ffffffffffffeda8 = (AttentionalModel<dynet::GRUBuilder> *)local_209;
    std::allocator<char>::allocator();
    local_20a = 1;
    std::__cxx11::string::string
              ((string *)(local_209 + 1),"gz-markov",(allocator *)in_stack_ffffffffffffeda8);
    local_20b = 1;
    in_stack_ffffffffffffed98 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
         ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                 (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
    bVar14 = in_stack_ffffffffffffed98 != 0;
  }
  uVar21 = bVar14;
  if ((local_20b & 1) != 0) {
    std::__cxx11::string::~string((string *)(local_209 + 1));
  }
  if ((local_20a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_209);
  }
  local_232 = 0;
  local_233 = 0;
  local_126a = true;
  local_1e4 = bVar14;
  if ((local_192 & 1) == 0) {
    std::allocator<char>::allocator();
    local_232 = 1;
    std::__cxx11::string::string(local_230,"gz-fertility",&local_231);
    local_233 = 1;
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                    (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
    local_126a = sVar2 != 0;
  }
  if ((local_233 & 1) != 0) {
    std::__cxx11::string::~string(local_230);
  }
  if ((local_232 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
  }
  local_20c = local_126a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"fertility",&local_259);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                  (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  local_234 = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"swap",&local_281);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                  (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  local_25a = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a8,"document",&local_2a9);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                  (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  local_282 = sVar2 != 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2d0,"RNN",&local_2d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"lstm",&local_2f9);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                  (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_320,"gru",&local_321);
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                    (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
    std::__cxx11::string::~string(local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
    if (sVar2 != 0) {
      std::__cxx11::string::operator=(local_2d0,"GRU");
    }
  }
  else {
    std::__cxx11::string::operator=(local_2d0,"LSTM");
  }
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
            *)0x1701ad);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
            *)0x1701ba);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
            *)0x1701c7);
  std::__cxx11::string::string(local_390);
  poVar4 = std::operator<<((ostream *)&std::cerr,"Reading training data from ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b0,"train",&local_3b1);
  boost::program_options::variables_map::operator[]
            ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
             (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
  pbVar5 = boost::program_options::variable_value::as<std::__cxx11::string>
                     ((variable_value *)0x170250);
  poVar4 = std::operator<<(poVar4,(string *)pbVar5);
  std::operator<<(poVar4,"...\n");
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"train",&local_3f1);
  boost::program_options::variables_map::operator[]
            ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
             (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
  boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x170308);
  read_corpus(in_stack_ffffffffffffeac8,(bool)uVar20);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::operator=((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
              (vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750));
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  dynet::Dict::freeze(&sd);
  dynet::Dict::freeze(&td);
  SRC_VOCAB_SIZE = dynet::Dict::size((Dict *)0x1703ad);
  TGT_VOCAB_SIZE = dynet::Dict::size((Dict *)0x1703c5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_418,"devel",&local_419);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                  (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
  std::__cxx11::string::~string(local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  if (sVar2 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Reading dev data from ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_440,"devel",&local_441);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
               (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    pbVar5 = boost::program_options::variable_value::as<std::__cxx11::string>
                       ((variable_value *)0x1704de);
    poVar4 = std::operator<<(poVar4,(string *)pbVar5);
    std::operator<<(poVar4,"...\n");
    std::__cxx11::string::~string(local_440);
    std::allocator<char>::~allocator((allocator<char> *)&local_441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_480,"devel",&local_481);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
               (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x170596);
    read_corpus(in_stack_ffffffffffffeac8,(bool)uVar20);
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::operator=((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                (vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750));
    std::__cxx11::string::~string(local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
  }
  std::allocator<char>::allocator();
  local_4d2 = 0;
  local_4d3 = 0;
  std::__cxx11::string::string(local_4a8,"test",&local_4a9);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                  (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
  bVar14 = false;
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    local_4d2 = 1;
    std::__cxx11::string::string(local_4d0,"rescore",&local_4d1);
    local_4d3 = 1;
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                    (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
    bVar14 = sVar2 != 0;
  }
  if ((local_4d3 & 1) != 0) {
    std::__cxx11::string::~string(local_4d0);
  }
  if ((local_4d2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  }
  std::__cxx11::string::~string(local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  if (bVar14) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Reading test examples from ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4f8,"test",&local_4f9);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
               (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    pbVar5 = boost::program_options::variable_value::as<std::__cxx11::string>
                       ((variable_value *)0x17098c);
    poVar4 = std::operator<<(poVar4,(string *)pbVar5);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_4f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_538,"test",&local_539);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
               (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x170a44);
    read_corpus(in_stack_ffffffffffffeac8,(bool)uVar20);
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::operator=((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                (vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                 *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
    std::
    vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
    ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
               *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750));
    std::__cxx11::string::~string(local_538);
    std::allocator<char>::~allocator((allocator<char> *)&local_539);
  }
  global_fert = (undefined1)((ulong)in_stack_ffffffffffffe828 >> 0x38);
  top_k = (uint)(in_stack_ffffffffffffed98 >> 0x20);
  uVar20 = (undefined1)((ulong)in_stack_ffffffffffffe908 >> 0x38);
  if ((local_25a & 1) != 0) {
    std::operator<<((ostream *)&std::cerr,"Swapping role of source and target\n");
    std::swap<dynet::Dict>(in_stack_ffffffffffffe790,in_stack_ffffffffffffe788);
    std::swap<int>(&kSRC_SOS,&kTGT_SOS);
    std::swap<int>(&kSRC_EOS,&kTGT_EOS);
    std::swap<unsigned_int>(&SRC_VOCAB_SIZE,&TGT_VOCAB_SIZE);
    local_548 = local_340;
    local_550._M_current =
         (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
          *)std::
            vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
            ::begin((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    local_558 = (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                 *)std::
                   vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   ::end((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    while (bVar14 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
                               (__normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738)),
          bVar14) {
      local_560 = __gnu_cxx::
                  __normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
                  ::operator*(&local_550);
      std::get<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                ((tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  *)0x170cd7);
      std::get<1ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                ((tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  *)0x170cec);
      std::swap<int,std::allocator<int>>
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
      __gnu_cxx::
      __normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
      ::operator++(&local_550);
    }
    local_568 = local_358;
    local_570._M_current =
         (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
          *)std::
            vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
            ::begin((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    local_578 = (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                 *)std::
                   vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   ::end((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    while (bVar14 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
                               (__normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
                                *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738)),
          bVar14) {
      local_580 = __gnu_cxx::
                  __normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
                  ::operator*(&local_570);
      std::get<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                ((tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  *)0x170d82);
      std::get<1ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                ((tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  *)0x170d97);
      std::swap<int,std::allocator<int>>
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
      __gnu_cxx::
      __normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
      ::operator++(&local_570);
    }
    local_588 = local_370;
    local_590._M_current =
         (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
          *)std::
            vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
            ::begin((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                     *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    local_598 = (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                 *)std::
                   vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                   ::end((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                          *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    while( true ) {
      bVar14 = __gnu_cxx::operator!=
                         ((__normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
                           *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
                          (__normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
                           *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
      global_fert = (undefined1)((ulong)in_stack_ffffffffffffe828 >> 0x38);
      top_k = (uint)(in_stack_ffffffffffffed98 >> 0x20);
      uVar20 = (undefined1)((ulong)in_stack_ffffffffffffe908 >> 0x38);
      if (!bVar14) break;
      local_5a0 = __gnu_cxx::
                  __normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
                  ::operator*(&local_590);
      std::get<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                ((tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  *)0x170e2d);
      std::get<1ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                ((tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                  *)0x170e42);
      std::swap<int,std::allocator<int>>
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
      __gnu_cxx::
      __normal_iterator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_*,_std::vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>_>
      ::operator++(&local_590);
    }
  }
  std::__cxx11::string::string(local_5c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5e0,"parameters",&local_5e1);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                  (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  if (sVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_630,"initialise",&local_631);
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
                    (key_type *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748));
    std::__cxx11::string::~string(local_630);
    std::allocator<char>::~allocator((allocator<char> *)&local_631);
    if (sVar2 == 0) {
      std::__cxx11::ostringstream::ostringstream(local_7d8);
      in_stack_ffffffffffffeb40 = std::operator<<((ostream *)local_7d8,"am");
      in_stack_ffffffffffffeb38 = std::operator<<(in_stack_ffffffffffffeb40,'_');
      poVar4 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffeb38,LAYERS);
      poVar4 = std::operator<<(poVar4,'_');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,HIDDEN_DIM);
      poVar4 = std::operator<<(poVar4,'_');
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,ALIGN_DIM);
      poVar4 = std::operator<<(poVar4,'_');
      poVar4 = std::operator<<(poVar4,local_2d0);
      poVar4 = std::operator<<(poVar4,"_b");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_16a & 1));
      poVar4 = std::operator<<(poVar4,"_g");
      pvVar6 = (void *)std::ostream::operator<<(poVar4,local_1ba & 1);
      pvVar6 = (void *)std::ostream::operator<<(pvVar6,local_1e4 & 1);
      poVar4 = (ostream *)std::ostream::operator<<(pvVar6,local_20c & 1);
      poVar4 = std::operator<<(poVar4,"_d");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(bool)(local_282 & 1));
      poVar4 = std::operator<<(poVar4,"-pid");
      _Var1 = getpid();
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,_Var1);
      std::operator<<(poVar4,".params");
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=(local_5c0,local_7f8);
      std::__cxx11::string::~string(local_7f8);
      std::__cxx11::ostringstream::~ostringstream(local_7d8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_658,"initialise",&local_659);
      in_stack_ffffffffffffeb50 =
           boost::program_options::variables_map::operator[]
                     ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740)
                      ,(string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
      in_stack_ffffffffffffeb48 =
           (AttentionalModel<dynet::GRUBuilder> *)
           boost::program_options::variable_value::as<std::__cxx11::string>
                     ((variable_value *)0x171124);
      std::__cxx11::string::operator=(local_5c0,(string *)in_stack_ffffffffffffeb48);
      std::__cxx11::string::~string(local_658);
      std::allocator<char>::~allocator((allocator<char> *)&local_659);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_608,"parameters",&local_609);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
               (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    pbVar5 = boost::program_options::variable_value::as<std::__cxx11::string>
                       ((variable_value *)0x170f61);
    std::__cxx11::string::operator=(local_5c0,(string *)pbVar5);
    std::__cxx11::string::~string(local_608);
    std::allocator<char>::~allocator((allocator<char> *)&local_609);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"Parameters will be written to: ");
  poVar4 = std::operator<<(poVar4,local_5c0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  dynet::Model::Model(local_880);
  local_888 = (long *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8b0,"sgd_trainer",&local_8b1);
  boost::program_options::variables_map::operator[]
            ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
             (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
  puVar3 = boost::program_options::variable_value::as<unsigned_int>((variable_value *)0x1715bd);
  uVar15 = *puVar3;
  std::__cxx11::string::~string(local_8b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_8b1);
  local_88c = uVar15;
  if (uVar15 == 1) {
    plVar7 = (long *)operator_new(0x78);
    local_8da = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8d8,"lr_eta",&local_8d9);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
               (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    boost::program_options::variable_value::as<float>((variable_value *)0x171689);
    dynet::MomentumSGDTrainer::MomentumSGDTrainer
              ((MomentumSGDTrainer *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
               (Model *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748),
               in_stack_ffffffffffffe744,in_stack_ffffffffffffe740,in_stack_ffffffffffffe73c);
    local_8da = 0;
    local_888 = plVar7;
    std::__cxx11::string::~string(local_8d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  }
  else if (uVar15 == 2) {
    plVar7 = (long *)operator_new(0x78);
    local_902 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_900,"lr_eta",&local_901);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
               (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    boost::program_options::variable_value::as<float>((variable_value *)0x171846);
    dynet::AdagradTrainer::AdagradTrainer
              ((AdagradTrainer *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
               (Model *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748),
               in_stack_ffffffffffffe744,in_stack_ffffffffffffe740,in_stack_ffffffffffffe73c);
    local_902 = 0;
    local_888 = plVar7;
    std::__cxx11::string::~string(local_900);
    std::allocator<char>::~allocator((allocator<char> *)&local_901);
  }
  else if (uVar15 == 3) {
    plVar7 = (long *)operator_new(0xa8);
    dynet::AdadeltaTrainer::AdadeltaTrainer
              ((AdadeltaTrainer *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
               (Model *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748),
               in_stack_ffffffffffffe744,in_stack_ffffffffffffe740,in_stack_ffffffffffffe73c);
    local_888 = plVar7;
  }
  else if (uVar15 == 4) {
    plVar7 = (long *)operator_new(0xb0);
    local_92a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_928,"lr_eta",&local_929);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
               (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    boost::program_options::variable_value::as<float>((variable_value *)0x171a25);
    dynet::AdamTrainer::AdamTrainer
              ((AdamTrainer *)CONCAT44(in_stack_ffffffffffffe764,in_stack_ffffffffffffe760),
               (Model *)CONCAT44(in_stack_ffffffffffffe75c,in_stack_ffffffffffffe758),
               in_stack_ffffffffffffe754,in_stack_ffffffffffffe750,in_stack_ffffffffffffe74c,
               in_stack_ffffffffffffe748,in_stack_ffffffffffffe744);
    local_92a = 0;
    local_888 = plVar7;
    std::__cxx11::string::~string(local_928);
    std::allocator<char>::~allocator((allocator<char> *)&local_929);
  }
  else if (uVar15 == 0) {
    plVar7 = (long *)operator_new(0x40);
    local_952 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_950,"lr_eta",&local_951);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
               (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    boost::program_options::variable_value::as<float>((variable_value *)0x171b90);
    dynet::SimpleSGDTrainer::SimpleSGDTrainer
              ((SimpleSGDTrainer *)CONCAT44(in_stack_ffffffffffffe754,in_stack_ffffffffffffe750),
               (Model *)CONCAT44(in_stack_ffffffffffffe74c,in_stack_ffffffffffffe748),
               in_stack_ffffffffffffe744,in_stack_ffffffffffffe740);
    local_952 = 0;
    local_888 = plVar7;
    std::__cxx11::string::~string(local_950);
    std::allocator<char>::~allocator((allocator<char> *)&local_951);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_978,"lr_eta_decay",&local_979);
  boost::program_options::variables_map::operator[]
            ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
             (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
  pMVar8 = (Model *)boost::program_options::variable_value::as<float>((variable_value *)0x171cc0);
  *(float *)(local_888 + 2) = *(float *)pMVar8;
  std::__cxx11::string::~string(local_978);
  std::allocator<char>::~allocator((allocator<char> *)&local_979);
  paVar16 = &local_9a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9a0,"sparse_updates",paVar16);
  boost::program_options::variables_map::operator[]
            ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,in_stack_ffffffffffffe740),
             (string *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
  pbVar9 = boost::program_options::variable_value::as<bool>((variable_value *)0x171d5c);
  *(byte *)(local_888 + 6) = *pbVar9 & 1;
  std::__cxx11::string::~string(local_9a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9a1);
  if ((*(byte *)(local_888 + 6) & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "Sparse updates for lookup parameter(s) to be disabled!");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  poVar4 = std::operator<<((ostream *)&std::cerr,"%% Using ");
  this = (AttentionalModel<dynet::GRUBuilder> *)std::operator<<(poVar4,local_2d0);
  poVar4 = std::operator<<((ostream *)this," recurrent units");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  uVar10 = local_282 & 1;
  uVar13 = local_1e4 & 1;
  uVar12 = local_1ba & 1;
  uVar11 = local_16a & 1;
  uVar15 = ALIGN_DIM;
  dynet::AttentionalModel<dynet::GRUBuilder>::AttentionalModel
            ((AttentionalModel<dynet::GRUBuilder> *)
             CONCAT17(in_stack_fffffffffffff147,
                      CONCAT16(in_stack_fffffffffffff146,
                               CONCAT15(in_stack_fffffffffffff145,in_stack_fffffffffffff140))),
             (Model *)CONCAT17(in_stack_fffffffffffff13f,
                               CONCAT16(in_stack_fffffffffffff13e,
                                        CONCAT24(in_stack_fffffffffffff13c,in_stack_fffffffffffff138
                                                ))),in_stack_fffffffffffff134,
             in_stack_fffffffffffff130,in_stack_fffffffffffff12c,in_stack_fffffffffffff128,
             in_stack_fffffffffffff170,(bool)in_stack_fffffffffffff127,
             (bool)in_stack_fffffffffffff126,(bool)in_stack_fffffffffffff125,
             (bool)in_stack_fffffffffffff124,(bool)in_stack_fffffffffffff123,
             (bool)in_stack_fffffffffffff122);
  uVar22 = (undefined2)(in_stack_fffffffffffff134 >> 0x10);
  local_dc9 = 0;
  paVar19 = &local_df1;
  std::allocator<char>::allocator();
  local_e1a = 0;
  local_e1b = 0;
  std::__cxx11::string::string(local_df0,"test",paVar19);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe754,uVar13),
                  (key_type *)CONCAT44(in_stack_ffffffffffffe74c,uVar12));
  bVar14 = false;
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    local_e1a = 1;
    std::__cxx11::string::string(local_e18,"rescore",&local_e19);
    local_e1b = 1;
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)CONCAT44(in_stack_ffffffffffffe754,uVar13),
                    (key_type *)CONCAT44(in_stack_ffffffffffffe74c,uVar12));
    bVar14 = sVar2 != 0;
  }
  if ((local_e1b & 1) != 0) {
    std::__cxx11::string::~string(local_e18);
  }
  if ((local_e1a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_e19);
  }
  std::__cxx11::string::~string(local_df0);
  std::allocator<char>::~allocator((allocator<char> *)&local_df1);
  if (bVar14) {
    dynet::AttentionalModel<dynet::GRUBuilder>::add_fertility_params
              (this,(Model *)poVar4,(uint)((ulong)paVar19 >> 0x20),SUB81((ulong)paVar19 >> 0x18,0));
    local_dc9 = 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e40,"initialise",&local_e41);
  sVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe754,uVar13),
                  (key_type *)CONCAT44(in_stack_ffffffffffffe74c,uVar12));
  std::__cxx11::string::~string(local_e40);
  std::allocator<char>::~allocator((allocator<char> *)&local_e41);
  if (sVar2 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e68,"initialise",&local_e69);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,uVar11),
               (string *)CONCAT44(in_stack_ffffffffffffe73c,uVar15));
    boost::program_options::variable_value::as<std::__cxx11::string>((variable_value *)0x17230f);
    initialise(pMVar8,(string *)paVar16);
    std::__cxx11::string::~string(local_e68);
    std::allocator<char>::~allocator((allocator<char> *)&local_e69);
  }
  if (((local_234 & 1) != 0) && ((local_dc9 & 1) == 0)) {
    dynet::AttentionalModel<dynet::GRUBuilder>::add_fertility_params
              (this,(Model *)poVar4,(uint)((ulong)paVar19 >> 0x20),SUB81((ulong)paVar19 >> 0x18,0));
  }
  std::allocator<char>::allocator();
  bVar24 = 0;
  bVar23 = 0;
  local_ee2 = 0;
  local_ee3 = 0;
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffff170,"test",(allocator *)&stack0xfffffffffffff16f);
  pMVar8 = (Model *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                             *)CONCAT44(in_stack_ffffffffffffe754,uVar13),
                            (key_type *)CONCAT44(in_stack_ffffffffffffe74c,uVar12));
  bVar17 = 0;
  if (pMVar8 == (Model *)0x0) {
    uVar20 = (undefined1)((ulong)(in_RDI + 0x10) >> 0x38);
    in_stack_ffffffffffffe910 = (allocator *)&stack0xfffffffffffff147;
    std::allocator<char>::allocator();
    bVar24 = 1;
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffff148,"kbest",in_stack_ffffffffffffe910);
    bVar23 = 1;
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)CONCAT44(in_stack_ffffffffffffe754,uVar13),
                    (key_type *)CONCAT44(in_stack_ffffffffffffe74c,uVar12));
    bVar17 = 0;
    if (sVar2 == 0) {
      std::allocator<char>::allocator();
      local_ee2 = 1;
      std::__cxx11::string::string(local_ee0,"fert-stats",&local_ee1);
      local_ee3 = 1;
      sVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)CONCAT44(in_stack_ffffffffffffe754,uVar13),
                      (key_type *)CONCAT44(in_stack_ffffffffffffe74c,uVar12));
      bVar17 = sVar2 != 0 ^ 0xff;
    }
  }
  bVar18 = bVar17;
  if ((local_ee3 & 1) != 0) {
    std::__cxx11::string::~string(local_ee0);
  }
  if ((local_ee2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_ee1);
  }
  if ((bVar23 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff148);
  }
  if ((bVar24 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff147);
  }
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff170);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff16f);
  if ((bVar17 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_fc8,"kbest",&local_fc9);
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)CONCAT44(in_stack_ffffffffffffe754,uVar13),
                    (key_type *)CONCAT44(in_stack_ffffffffffffe74c,uVar12));
    std::__cxx11::string::~string(local_fc8);
    std::allocator<char>::~allocator((allocator<char> *)&local_fc9);
    if (sVar2 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1060,"test",&local_1061);
      sVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)CONCAT44(in_stack_ffffffffffffe754,uVar13),
                      (key_type *)CONCAT44(in_stack_ffffffffffffe74c,uVar12));
      std::__cxx11::string::~string(local_1060);
      std::allocator<char>::~allocator((allocator<char> *)&local_1061);
      if (sVar2 == 0) {
        paVar16 = &local_1121;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1120,"fert-stats",paVar16);
        sVar2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)CONCAT44(in_stack_ffffffffffffe754,uVar13),
                        (key_type *)CONCAT44(in_stack_ffffffffffffe74c,uVar12));
        std::__cxx11::string::~string(local_1120);
        std::allocator<char>::~allocator((allocator<char> *)&local_1121);
        if (sVar2 != 0) {
          paVar16 = &local_1149;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1148,"fertility",paVar16);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe754,uVar13),
                  (key_type *)CONCAT44(in_stack_ffffffffffffe74c,uVar12));
          fert_stats<dynet::AttentionalModel<dynet::GRUBuilder>>
                    (in_stack_ffffffffffffe840,in_stack_ffffffffffffe838,in_stack_ffffffffffffe830,
                     (bool)global_fert);
          std::__cxx11::string::~string(local_1148);
          std::allocator<char>::~allocator((allocator<char> *)&local_1149);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1088,"rescore",&local_1089);
        sVar2 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                         *)CONCAT44(in_stack_ffffffffffffe754,uVar13),
                        (key_type *)CONCAT44(in_stack_ffffffffffffe74c,uVar12));
        std::__cxx11::string::~string(local_1088);
        std::allocator<char>::~allocator((allocator<char> *)&local_1089);
        if (sVar2 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_10d0,"test",&local_10d1);
          boost::program_options::variables_map::operator[]
                    ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,uVar11),
                     (string *)CONCAT44(in_stack_ffffffffffffe73c,uVar15));
          pbVar5 = boost::program_options::variable_value::as<std::__cxx11::string>
                             ((variable_value *)0x1730f8);
          std::__cxx11::string::string(local_10b0,(string *)pbVar5);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_10f8,"beam",&local_10f9);
          boost::program_options::variables_map::operator[]
                    ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,uVar11),
                     (string *)CONCAT44(in_stack_ffffffffffffe73c,uVar15));
          boost::program_options::variable_value::as<unsigned_int>((variable_value *)0x173186);
          test_decode<dynet::AttentionalModel<dynet::GRUBuilder>>
                    ((Model *)in_stack_ffffffffffffeb50,in_stack_ffffffffffffeb48,
                     (string *)in_stack_ffffffffffffeb40,
                     SUB81((ulong)in_stack_ffffffffffffeb38 >> 0x38,0),
                     (uint)in_stack_ffffffffffffeb38);
          std::__cxx11::string::~string(local_10f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_10f9);
          std::__cxx11::string::~string(local_10b0);
          std::__cxx11::string::~string(local_10d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_10d1);
        }
        else {
          test_rescore<dynet::AttentionalModel<dynet::GRUBuilder>>
                    (pMVar8,(AttentionalModel<dynet::GRUBuilder> *)
                            CONCAT17(bVar18,in_stack_ffffffffffffe918),
                     (Corpus *)in_stack_ffffffffffffe910,(bool)uVar20);
        }
      }
    }
    else {
      paVar16 = &local_1011;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1010,"kbest",paVar16);
      boost::program_options::variables_map::operator[]
                ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,uVar11),
                 (string *)CONCAT44(in_stack_ffffffffffffe73c,uVar15));
      pbVar5 = boost::program_options::variable_value::as<std::__cxx11::string>
                         ((variable_value *)0x172cd6);
      std::__cxx11::string::string(local_ff0,(string *)pbVar5);
      paVar16 = &local_1039;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1038,"topk",paVar16);
      boost::program_options::variables_map::operator[]
                ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,uVar11),
                 (string *)CONCAT44(in_stack_ffffffffffffe73c,uVar15));
      boost::program_options::variable_value::as<unsigned_int>((variable_value *)0x172d56);
      test_kbest_arcs<dynet::AttentionalModel<dynet::GRUBuilder>>
                ((Model *)CONCAT17(local_1229,CONCAT16(uVar21,in_stack_ffffffffffffedb0)),
                 in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0,top_k);
      std::__cxx11::string::~string(local_1038);
      std::allocator<char>::~allocator((allocator<char> *)&local_1039);
      std::__cxx11::string::~string(local_ff0);
      std::__cxx11::string::~string(local_1010);
      std::allocator<char>::~allocator((allocator<char> *)&local_1011);
    }
  }
  else {
    std::__cxx11::string::string(local_f08,local_5c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f28,"curriculum",&local_f29);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
    ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             *)CONCAT44(in_stack_ffffffffffffe754,uVar13),
            (key_type *)CONCAT44(in_stack_ffffffffffffe74c,uVar12));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f50,"epochs",&local_f51);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,uVar11),
               (string *)CONCAT44(in_stack_ffffffffffffe73c,uVar15));
    boost::program_options::variable_value::as<int>((variable_value *)0x17277f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f78,"coverage",&local_f79);
    boost::program_options::variables_map::operator[]
              ((variables_map *)CONCAT44(in_stack_ffffffffffffe744,uVar11),
               (string *)CONCAT44(in_stack_ffffffffffffe73c,uVar15));
    boost::program_options::variable_value::as<float>((variable_value *)0x172807);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_fa0,"display",&local_fa1);
    sVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)CONCAT44(in_stack_ffffffffffffe754,uVar13),
                    (key_type *)CONCAT44(in_stack_ffffffffffffe74c,uVar12));
    uVar13 = (uint)(sVar2 != 0);
    train<dynet::AttentionalModel<dynet::GRUBuilder>>
              (in_stack_fffffffffffff168,in_stack_fffffffffffff160,in_stack_fffffffffffff158,
               in_stack_fffffffffffff150,in_stack_fffffffffffff148,
               (string *)
               CONCAT17(in_stack_fffffffffffff147,
                        CONCAT16(bVar24,CONCAT15(bVar23,in_stack_fffffffffffff140))),
               (bool)in_stack_fffffffffffff13f,in_stack_fffffffffffff188,
               (bool)in_stack_fffffffffffff13e,in_stack_fffffffffffff138,
               SUB21((ushort)uVar22 >> 8,0),SUB21(uVar22,0));
    std::__cxx11::string::~string(local_fa0);
    std::allocator<char>::~allocator((allocator<char> *)&local_fa1);
    std::__cxx11::string::~string(local_f78);
    std::allocator<char>::~allocator((allocator<char> *)&local_f79);
    std::__cxx11::string::~string(local_f50);
    std::allocator<char>::~allocator((allocator<char> *)&local_f51);
    std::__cxx11::string::~string(local_f28);
    std::allocator<char>::~allocator((allocator<char> *)&local_f29);
    std::__cxx11::string::~string(local_f08);
  }
  if (local_888 != (long *)0x0) {
    (**(code **)(*local_888 + 8))();
  }
  dynet::AttentionalModel<dynet::GRUBuilder>::~AttentionalModel
            ((AttentionalModel<dynet::GRUBuilder> *)CONCAT44(in_stack_ffffffffffffe764,uVar10));
  dynet::Model::~Model(local_880);
  std::__cxx11::string::~string(local_5c0);
  std::__cxx11::string::~string(local_390);
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             *)CONCAT44(in_stack_ffffffffffffe754,uVar13));
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             *)CONCAT44(in_stack_ffffffffffffe754,uVar13));
  std::
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::~vector((vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
             *)CONCAT44(in_stack_ffffffffffffe754,uVar13));
  std::__cxx11::string::~string(local_2d0);
  return 0;
}

Assistant:

int main_body(variables_map vm)
{
    kSRC_SOS = sd.convert("<s>");
    kSRC_EOS = sd.convert("</s>");
    kTGT_SOS = td.convert("<s>");
    kTGT_EOS = td.convert("</s>");
    verbose = vm.count("verbose");

    LAYERS = vm["layers"].as<int>(); 
    ALIGN_DIM = vm["align"].as<int>(); 
    HIDDEN_DIM = vm["hidden"].as<int>(); 
    bool bidir = vm.count("bidirectional");
    bool giza = vm.count("giza");
    bool giza_pos = giza || vm.count("gz-position");
    bool giza_markov = giza || vm.count("gz-markov");
    bool giza_fert = giza || vm.count("gz-fertility");
    bool fert = vm.count("fertility");
    bool swap = vm.count("swap");
    bool doco = vm.count("document");
    string flavour = "RNN";
    if (vm.count("lstm"))	flavour = "LSTM";
    else if (vm.count("gru"))	flavour = "GRU";

    Corpus training, devel, testing;
    string line;
    cerr << "Reading training data from " << vm["train"].as<string>() << "...\n";
    training = read_corpus(vm["train"].as<string>(), doco);
    sd.freeze(); // no new word types allowed
    td.freeze(); // no new word types allowed
    
    SRC_VOCAB_SIZE = sd.size();
    TGT_VOCAB_SIZE = td.size();

    if (vm.count("devel")) {
	cerr << "Reading dev data from " << vm["devel"].as<string>() << "...\n";
	devel = read_corpus(vm["devel"].as<string>(), doco);
    }

    if (vm.count("test") && vm.count("rescore")) {
        // otherwise "test" file is assumed just to contain source language strings
        cerr << "Reading test examples from " << vm["test"].as<string>() << endl;
        testing = read_corpus(vm["test"].as<string>(), doco);
    }

    if (swap) {
	cerr << "Swapping role of source and target\n";
        std::swap(sd, td);
        std::swap(kSRC_SOS, kTGT_SOS);
        std::swap(kSRC_EOS, kTGT_EOS);
        std::swap(SRC_VOCAB_SIZE, TGT_VOCAB_SIZE);
        for (auto &sent: training)
            std::swap(get<0>(sent), get<1>(sent));
        for (auto &sent: devel)
            std::swap(get<0>(sent), get<1>(sent));
        for (auto &sent: testing)
            std::swap(get<0>(sent), get<1>(sent));
    }

    string fname;
    if (vm.count("parameters"))
    	fname = vm["parameters"].as<string>();
    else if (vm.count("initialise"))
    	fname = vm["initialise"].as<string>();
    else {
		ostringstream os;
		os << "am"
			<< '_' << LAYERS
			<< '_' << HIDDEN_DIM
			<< '_' << ALIGN_DIM
			<< '_' << flavour
			<< "_b" << bidir
			<< "_g" << (int)giza_pos << (int)giza_markov << (int)giza_fert
			<< "_d" << doco
			<< "-pid" << getpid() << ".params";
		fname = os.str();
	}

	cerr << "Parameters will be written to: " << fname << endl;

   Model model;
   Trainer* sgd = nullptr;
   unsigned sgd_type = vm["sgd_trainer"].as<unsigned>();
   if (sgd_type == 1)
       sgd = new MomentumSGDTrainer(model, vm["lr_eta"].as<float>());
   else if (sgd_type == 2)
       sgd = new AdagradTrainer(model, vm["lr_eta"].as<float>());
   else if (sgd_type == 3)
       sgd = new AdadeltaTrainer(model);
   else if (sgd_type == 4)
       sgd = new AdamTrainer(model, vm["lr_eta"].as<float>());
   else if (sgd_type == 0)//Vanilla SGD trainer
       sgd = new SimpleSGDTrainer(model, vm["lr_eta"].as<float>());
   else
       assert("Unknown SGD trainer type! (0: vanilla SGD; 1: momentum SGD; 2: Adagrad; 3: AdaDelta; 4: Adam)");
   sgd->eta_decay = vm["lr_eta_decay"].as<float>();
   sgd->sparse_updates_enabled = vm["sparse_updates"].as<bool>();
   if (!sgd->sparse_updates_enabled)
      cerr << "Sparse updates for lookup parameter(s) to be disabled!" << endl;

   cerr << "%% Using " << flavour << " recurrent units" << endl;
   AttentionalModel<rnn_t> am(&model, SRC_VOCAB_SIZE, TGT_VOCAB_SIZE,
	    LAYERS, HIDDEN_DIM, ALIGN_DIM, bidir, giza_pos, giza_markov, giza_fert, doco, !fert);

   bool add_fer = false;
   if (vm.count("test") && vm.count("rescore"))
   {
	   am.add_fertility_params(&model, HIDDEN_DIM, bidir);
	   add_fer = true;
   }

   if (vm.count("initialise")) initialise(model, vm["initialise"].as<string>());

   if (fert && !add_fer) am.add_fertility_params(&model, HIDDEN_DIM, bidir);

   if (!vm.count("test") && !vm.count("kbest") && !vm.count("fert-stats"))
    	train(model, am, training, devel, *sgd, fname, vm.count("curriculum"),
                vm["epochs"].as<int>(), doco, vm["coverage"].as<float>(), vm.count("display"),
                fert);
    else if (vm.count("kbest"))
    	test_kbest_arcs(model, am, vm["kbest"].as<string>(), vm["topk"].as<unsigned>());
    else if (vm.count("test")) {
        if (vm.count("rescore"))
            test_rescore(model, am, testing, doco);
        else // test
            test_decode(model, am, vm["test"].as<string>(), doco, vm["beam"].as<unsigned>());
    }
    else if (vm.count("fert-stats"))
        fert_stats(model, am, devel, vm.count("fertility"));

    delete sgd;

    //dynet::Free();

    return EXIT_SUCCESS;
}